

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<double>::Print(TPZFileEqnStorage<double> *this,char *name,ostream *out)

{
  long __off;
  ostream *poVar1;
  long lVar2;
  TPZEqnArray<double> REqnArray;
  TPZEqnArray<double> TStack_32b8;
  
  TPZEqnArray<double>::TPZEqnArray(&TStack_32b8);
  poVar1 = std::operator<<(out,"Number of entries on File  ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar2 = 0;
      lVar2 < (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
      lVar2 = lVar2 + 1) {
    __off = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar2];
    if (__off != 0) {
      fseek((FILE *)this->fIOStream,__off,0);
      TPZEqnArray<double>::Read(&TStack_32b8,this->fIOStream);
      TPZEqnArray<double>::Print(&TStack_32b8,name,out);
    }
  }
  TPZEqnArray<double>::~TPZEqnArray(&TStack_32b8);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Print(const char *name, std::ostream& out) const {
    int i;
	TPZEqnArray<TVar> REqnArray;
	out <<  "Number of entries on File  "<< fBlockPos.NElements() << endl;
	for(i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.Print(name, out);
		}
	}
}